

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

int __thiscall JetHead::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  int iVar1;
  DIR *pDVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  dirent *dir_ptr;
  dirent dir;
  
  uVar4 = 0;
  bVar3 = 0;
  if (this->mDirHandle != (void *)0x0) {
LAB_00118d56:
    return (int)bVar3;
  }
  pDVar2 = opendir(*(char **)__file);
  this->mDirHandle = pDVar2;
  vector<JetHead::Path>::reserve(&this->mData,0x32);
  dir_ptr = &dir;
  do {
    bVar5 = dir_ptr == (dirent *)0x0;
    do {
      bVar3 = 0x31 < uVar4 | bVar5;
      if (bVar3 != 0) {
        if (bVar5 != false) {
          this->mNumberEntries = uVar4 + 1;
        }
        goto LAB_00118d56;
      }
      iVar1 = readdir_r((DIR *)this->mDirHandle,(dirent *)&dir,(dirent **)&dir_ptr);
      if (iVar1 != 0) goto LAB_00118d56;
      bVar5 = true;
    } while (dir_ptr == (dirent *)0x0);
    std::__cxx11::string::assign((char *)((this->mData).mData + uVar4));
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool Directory::open( const Path &p )
{
	if ( mDirHandle != NULL )
		return false;

	mDirHandle = opendir( p.getString().c_str() );

	mData.reserve( gNumberEntries );

	struct dirent dir;
	struct dirent *dir_ptr = &dir;
	int i = 0;

	// fill with the first gNumberEntries files.  This is done to keep this
	//  from taking too much time if the directory has 1000's of files.
	while ( dir_ptr != NULL && i < gNumberEntries )
	{
		if ( readdir_r( DIR_HANDLE, &dir, &dir_ptr ) != 0 )
			return false;

		if ( dir_ptr != NULL )
		{
			mData[ i ] = dir_ptr->d_name;
			i += 1;
		}
	}

	if ( dir_ptr == NULL )
		mNumberEntries = i + 1;

	return true;
}